

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataParser::Error(DataParser *this,String *message)

{
  long *plVar1;
  long *plVar2;
  String cursor_string;
  long *local_58;
  long local_48;
  long lStack_40;
  long *local_38;
  ulong local_30;
  long local_28 [2];
  
  this->parse_error = true;
  Log::Message(LT_WARNING,"Error in data expression at %zu. %s",this->index,
               (message->_M_dataplus)._M_p);
  Log::Message(LT_WARNING,"  \"%s\"",(this->expression)._M_dataplus._M_p);
  local_38 = local_28;
  ::std::__cxx11::string::_M_construct((ulong)&local_38,(char)this->index + '\x03');
  plVar1 = (long *)::std::__cxx11::string::_M_replace_aux((ulong)&local_38,local_30,0,'\x01');
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  Log::Message(LT_WARNING,"%s",local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return;
}

Assistant:

void Error(const String& message)
	{
		parse_error = true;
		Log::Message(Log::LT_WARNING, "Error in data expression at %zu. %s", index, message.c_str());
		Log::Message(Log::LT_WARNING, "  \"%s\"", expression.c_str());

		const size_t cursor_offset = size_t(index) + 3;
		const String cursor_string = String(cursor_offset, ' ') + '^';
		Log::Message(Log::LT_WARNING, "%s", cursor_string.c_str());
	}